

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuValuesInParamsGenerator<std::tuple<bool,int>>::
iuValuesInParamsGenerator<std::tuple<bool,int>,1ul>
          (iuValuesInParamsGenerator<std::tuple<bool,int>> *this,tuple<bool,_int> (*values) [1])

{
  vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>> *this_00;
  __normal_iterator<std::tuple<bool,_int>_*,_std::vector<std::tuple<bool,_int>,_std::allocator<std::tuple<bool,_int>_>_>_>
  local_28;
  const_iterator local_20;
  tuple<bool,_int> *local_18;
  tuple<bool,_int> (*values_local) [1];
  iuValuesInParamsGenerator<std::tuple<bool,_int>_>_conflict *this_local;
  
  local_18 = *values;
  values_local = (tuple<bool,_int> (*) [1])this;
  iuIParamGenerator<std::tuple<bool,_int>_>::iuIParamGenerator
            ((iuIParamGenerator<std::tuple<bool,_int>_> *)this);
  *(undefined ***)this = &PTR__iuValuesInParamsGenerator_006134b0;
  this_00 = (vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>> *)(this + 8);
  std::vector<std::tuple<bool,_int>,_std::allocator<std::tuple<bool,_int>_>_>::vector
            ((vector<std::tuple<bool,_int>,_std::allocator<std::tuple<bool,_int>_>_> *)this_00);
  __gnu_cxx::
  __normal_iterator<const_std::tuple<bool,_int>_*,_std::vector<std::tuple<bool,_int>,_std::allocator<std::tuple<bool,_int>_>_>_>
  ::__normal_iterator((__normal_iterator<const_std::tuple<bool,_int>_*,_std::vector<std::tuple<bool,_int>,_std::allocator<std::tuple<bool,_int>_>_>_>
                       *)(this + 0x20));
  local_28._M_current =
       (tuple<bool,_int> *)
       std::vector<std::tuple<bool,_int>,_std::allocator<std::tuple<bool,_int>_>_>::end
                 ((vector<std::tuple<bool,_int>,_std::allocator<std::tuple<bool,_int>_>_> *)this_00)
  ;
  __gnu_cxx::
  __normal_iterator<std::tuple<bool,int>const*,std::vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>>>
  ::__normal_iterator<std::tuple<bool,int>*>
            ((__normal_iterator<std::tuple<bool,int>const*,std::vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>>>
              *)&local_20,&local_28);
  std::vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>>::
  insert<std::tuple<bool,int>const*,void>(this_00,local_20,local_18,local_18 + 1);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }